

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_next_header_empty.c
# Opt level: O0

void test_empty_file1(void)

{
  archive *a_00;
  undefined4 unaff_retaddr;
  wchar_t unaff_retaddr_00;
  char *in_stack_00000008;
  archive *a;
  char *in_stack_00000018;
  void *in_stack_00000020;
  archive *in_stack_00000028;
  void *in_stack_00000030;
  wchar_t in_stack_00000038;
  void *extra;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar1;
  uint in_stack_fffffffffffffff4;
  
  a_00 = archive_read_new();
  archive_read_support_format_raw(in_stack_00000028);
  assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)a_00,
                      (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),0,
                      (char *)0x1343a6,in_stack_00000020);
  archive_errno(a_00);
  assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)a_00,
                      (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),0,
                      (char *)0x1343de,in_stack_00000020);
  archive_error_string(a_00);
  uVar1 = 0;
  assertion_equal_string
            (in_stack_00000018,a._4_4_,in_stack_00000008,
             (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)a_00,
             (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,in_stack_00000038)
  ;
  archive_read_open_filename
            ((archive *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)a_00,
             CONCAT44(in_stack_fffffffffffffff4,uVar1));
  extra = (void *)0x0;
  assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)a_00,
                      (char *)CONCAT44(in_stack_fffffffffffffff4,uVar1),0,(char *)0x134468,
                      in_stack_00000020);
  archive_error_string(a_00);
  assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(wchar_t)((ulong)a_00 >> 0x20),
                   (wchar_t)a_00,(char *)CONCAT44(in_stack_fffffffffffffff4,uVar1),extra);
  archive_read_free((archive *)0x1344a9);
  return;
}

Assistant:

static void
test_empty_file1(void)
{
	struct archive* a = archive_read_new();

	/* Try opening an empty file with the raw handler. */
	assertEqualInt(ARCHIVE_OK, archive_read_support_format_raw(a));
	assertEqualInt(0, archive_errno(a));
	assertEqualString(NULL, archive_error_string(a));

	/* Raw handler doesn't support empty files. */
	assertEqualInt(ARCHIVE_FATAL, archive_read_open_filename(a, "emptyfile", 0));
	assert(NULL != archive_error_string(a));

	archive_read_free(a);
}